

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorRepresentable
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  anon_union_16_3_1194ccdc_for_v aVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  TextureChannelClass TVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  GenericVec4 GVar13;
  BVec4 channelMask;
  Vec4 sRGB;
  Vec4 linearized;
  ArrayBuffer<unsigned_char,_4UL,_1UL> buffer;
  PixelBufferAccess access;
  Vector<bool,_4> local_bc;
  Vec4 local_b8;
  undefined1 local_a8 [24];
  int aiStack_90 [2];
  Vec4 local_88;
  ArrayBuffer<unsigned_char,_4UL,_1UL> local_78;
  PixelBufferAccess local_68;
  Vector<float,_4> local_40;
  
  GVar13 = mapToFormatColorUnits(texFormat,normalizedRange);
  tcu::getTextureFormatChannelMask((tcu *)&local_bc,texFormat);
  iVar8 = tcu::TextureFormat::getPixelSize(texFormat);
  de::ArrayBuffer<unsigned_char,_4UL,_1UL>::ArrayBuffer(&local_78,(long)iVar8);
  local_b8.m_data._0_8_ = (void *)0x100000001;
  local_b8.m_data[2] = 1.4013e-45;
  tcu::PixelBufferAccess::PixelBufferAccess(&local_68,texFormat,(IVec3 *)&local_b8,local_78.m_ptr);
  bVar3 = tcu::isSRGB(*texFormat);
  if (bVar3) {
    tcu::linearToSRGB((tcu *)&local_b8,normalizedRange);
    bVar4 = tcu::floatToU8(local_b8.m_data[0]);
    bVar5 = tcu::floatToU8(local_b8.m_data[1]);
    bVar6 = tcu::floatToU8(local_b8.m_data[2]);
    bVar7 = tcu::floatToU8(local_b8.m_data[3]);
    auVar12._0_4_ = (float)bVar4;
    auVar12._4_4_ = (float)bVar5;
    auVar12._8_4_ = (float)bVar6;
    auVar12._12_4_ = (float)bVar7;
    local_88.m_data = (float  [4])divps(auVar12,_DAT_008180c0);
    tcu::sRGBToLinear((tcu *)local_a8,&local_88);
    tcu::Vector<float,_4>::Vector(&local_40,0.0);
    tcu::select<float,4>((tcu *)&local_88,(Vector<float,_4> *)local_a8,&local_40,&local_bc);
    local_a8._16_8_ = local_88.m_data._0_8_;
    aiStack_90 = (int  [2])local_88.m_data._8_8_;
  }
  else {
    TVar9 = tcu::getTextureChannelClass(texFormat->type);
    uVar2 = local_b8.m_data._0_8_;
    fVar11 = GVar13.v._8_4_;
    fVar10 = GVar13.v._12_4_;
    local_b8.m_data._0_8_ = GVar13.v._0_8_;
    switch(TVar9) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      local_b8.m_data[2] = fVar11;
      local_b8.m_data[3] = fVar10;
      tcu::PixelBufferAccess::setPixel(&local_68,&local_b8,0,0,0);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_a8,(int)&local_68,0,0);
      tcu::Vector<float,_4>::Vector(&local_88,0.0);
      tcu::select<float,4>((tcu *)&local_b8,(Vector<float,_4> *)local_a8,&local_88,&local_bc);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      local_b8.m_data[2] = fVar11;
      local_b8.m_data[3] = fVar10;
      tcu::PixelBufferAccess::setPixel(&local_68,(IVec4 *)&local_b8,0,0,0);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_a8,(int)&local_68,0,0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_88,0);
      tcu::select<int,4>((tcu *)&local_b8,(Vector<int,_4> *)local_a8,(Vector<int,_4> *)&local_88,
                         &local_bc);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      local_b8.m_data[2] = fVar11;
      local_b8.m_data[3] = fVar10;
      tcu::PixelBufferAccess::setPixel(&local_68,(UVec4 *)&local_b8,0,0,0);
      tcu::ConstPixelBufferAccess::getPixelUint
                ((ConstPixelBufferAccess *)local_a8,(int)&local_68,0,0);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_88,0);
      tcu::select<unsigned_int,4>
                ((tcu *)&local_b8,(Vector<unsigned_int,_4> *)local_a8,
                 (Vector<unsigned_int,_4> *)&local_88,&local_bc);
      break;
    default:
      local_a8._16_8_ = (void *)0x0;
      aiStack_90[0] = 0;
      aiStack_90[1] = 0;
      local_b8.m_data._0_8_ = uVar2;
      goto LAB_004ad36e;
    }
    aiStack_90[1] = (int)local_b8.m_data[3];
    aiStack_90[0] = (int)local_b8.m_data[2];
    local_a8._16_8_ = local_b8.m_data._0_8_;
  }
LAB_004ad36e:
  de::ArrayBuffer<unsigned_char,_4UL,_1UL>::clear(&local_78);
  aVar1._8_4_ = aiStack_90[0];
  aVar1._12_4_ = aiStack_90[1];
  aVar1._0_8_ = local_a8._16_8_;
  return (GenericVec4)aVar1;
}

Assistant:

rr::GenericVec4 mapToFormatColorRepresentable (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	// make sure value is representable in the target format and clear channels
	// not present in the target format.

	const rr::GenericVec4		inFormatUnits	= mapToFormatColorUnits(texFormat, normalizedRange);
	const tcu::BVec4			channelMask		= tcu::getTextureFormatChannelMask(texFormat);
	de::ArrayBuffer<deUint8, 4>	buffer			(texFormat.getPixelSize());
	tcu::PixelBufferAccess		access			(texFormat, tcu::IVec3(1, 1, 1), buffer.getPtr());

	if (tcu::isSRGB(texFormat))
	{
		DE_ASSERT(texFormat.type == tcu::TextureFormat::UNORM_INT8);

		// make sure border color (in linear space) can be converted to 8-bit sRGB space without
		// significant loss.
		const tcu::Vec4		sRGB		= tcu::linearToSRGB(normalizedRange);
		const tcu::IVec4	sRGB8		= tcu::IVec4(tcu::floatToU8(sRGB[0]),
													 tcu::floatToU8(sRGB[1]),
													 tcu::floatToU8(sRGB[2]),
													 tcu::floatToU8(sRGB[3]));
		const tcu::Vec4		linearized	= tcu::sRGBToLinear(tcu::Vec4((float)sRGB8[0] / 255.0f,
																	  (float)sRGB8[1] / 255.0f,
																	  (float)sRGB8[2] / 255.0f,
																	  (float)sRGB8[3] / 255.0f));

		return rr::GenericVec4(tcu::select(linearized, tcu::Vec4(0.0f), channelMask));
	}

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		{
			access.setPixel(inFormatUnits.get<float>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixel(0, 0), tcu::Vec4(0.0f), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deInt32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelInt(0, 0), tcu::IVec4(0), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deUint32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelUint(0, 0), tcu::UVec4(0u), channelMask));
		}
		default:
		{
			DE_ASSERT(false);
			return rr::GenericVec4();
		}
	}
}